

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_tree.cpp
# Opt level: O2

void __thiscall
HuffTree::HuffTree(HuffTree *this,
                  unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
                  *data)

{
  long lVar1;
  int *piVar2;
  __uniq_ptr_data<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>,_true,_true> __p_00;
  undefined8 __p_01;
  pointer __p;
  ulong uVar3;
  __node_base *p_Var4;
  unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> l;
  unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> r;
  undefined1 local_c8 [16];
  __uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> local_b8;
  __uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> _Stack_b0;
  __uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> local_a8;
  bool local_a0;
  unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *local_98;
  unordered_map<char,_int,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_int>_>_>
  *local_90;
  __uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> local_88;
  __uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> local_80;
  __uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> local_78;
  __uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> local_70;
  __uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> local_68;
  __uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> local_60;
  priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_jeinygroove[P]Huffman_Archiver_src_huffman_tree_cpp:14:17)>
  local_58;
  
  this->curr_node = (TreeNode *)0x0;
  (this->root)._M_t.
  super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
  super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
  super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl = (TreeNode *)0x0;
  local_98 = &this->root;
  local_58.c.
  super__Vector_base<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.c.
  super__Vector_base<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.c.
  super__Vector_base<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._M_t.
  super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
  super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl =
       (tuple<HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)
       (_Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)0x0;
  _Stack_b0._M_t.
  super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
  super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl =
       (tuple<HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)
       (_Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)0x0;
  local_a8._M_t.
  super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
  super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl =
       (tuple<HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)
       (_Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)0x0;
  std::
  vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
  ::~vector((vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
             *)&local_b8);
  p_Var4 = &(data->_M_h)._M_before_begin;
  local_90 = data;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    local_b8._M_t.
    super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
    super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl._0_1_ =
         (char)*(size_type *)(p_Var4 + 1);
    local_b8._M_t.
    super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
    super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl._4_4_ =
         *(undefined4 *)((long)(p_Var4 + 1) + 4);
    _Stack_b0._M_t.
    super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
    super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl =
         (tuple<HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)
         (_Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)0x0;
    local_a8._M_t.
    super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
    super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl =
         (tuple<HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)
         (_Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)0x0;
    local_60._M_t.
    super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
    super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl =
         (tuple<HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)
         (_Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)0x0;
    local_68._M_t.
    super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
    super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl =
         (tuple<HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)
         (_Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)0x0;
    local_a0 = true;
    std::make_unique<HuffTree::TreeNode,HuffTree::TreeNode>((TreeNode *)local_c8);
    std::
    priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/src/huffman_tree.cpp:14:17)>
    ::push(&local_58,(value_type *)local_c8);
    std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)local_c8)
    ;
    TreeNode::~TreeNode((TreeNode *)&local_b8);
    std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)&local_68
              );
    std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)&local_60
              );
  }
  for (uVar3 = (local_90->_M_h)._M_element_count; 1 < uVar3; uVar3 = uVar3 - 1) {
    local_c8._0_8_ =
         ((local_58.c.
           super__Vector_base<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
         super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
         super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl;
    ((local_58.c.
      super__Vector_base<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->_M_t).
    super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
    super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
    super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl = (TreeNode *)0x0;
    std::
    priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/src/huffman_tree.cpp:14:17)>
    ::pop(&local_58);
    local_c8._8_8_ =
         ((local_58.c.
           super__Vector_base<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
         super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
         super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl;
    ((local_58.c.
      super__Vector_base<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->_M_t).
    super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
    super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
    super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl = (TreeNode *)0x0;
    std::
    priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/src/huffman_tree.cpp:14:17)>
    ::pop(&local_58);
    local_a8._M_t.
    super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
    super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl =
         (tuple<HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)
         (tuple<HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)local_c8._8_8_;
    _Stack_b0._M_t.
    super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
    super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl =
         (tuple<HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)
         (tuple<HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)local_c8._0_8_;
    lVar1 = local_c8._8_8_ + 4;
    piVar2 = (int *)(local_c8._0_8_ + 4);
    local_c8._0_8_ =
         (__uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>)0x0;
    local_c8._8_8_ =
         (__uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>)0x0;
    local_b8._M_t.
    super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
    super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl._0_1_ = 0x20;
    local_b8._M_t.
    super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
    super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl._4_4_ = *(int *)lVar1 + *piVar2;
    local_70._M_t.
    super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
    super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl =
         (tuple<HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)
         (_Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)0x0;
    local_78._M_t.
    super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
    super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl =
         (tuple<HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)
         (_Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)0x0;
    local_a0 = false;
    std::make_unique<HuffTree::TreeNode,HuffTree::TreeNode>((TreeNode *)&stack0xffffffffffffffc8);
    std::
    priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/src/huffman_tree.cpp:14:17)>
    ::push(&local_58,(value_type *)&stack0xffffffffffffffc8);
    std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
               &stack0xffffffffffffffc8);
    TreeNode::~TreeNode((TreeNode *)&local_b8);
    std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)&local_78
              );
    std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)&local_70
              );
    std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
               (local_c8 + 8));
    std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)local_c8)
    ;
  }
  if (local_58.c.
      super__Vector_base<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.c.
      super__Vector_base<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __p_00.super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
    super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
    super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl =
         (__uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>)
         ((local_58.c.
           super__Vector_base<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
         super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
         super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl;
    ((local_58.c.
      super__Vector_base<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->_M_t).
    super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
    super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
    super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl = (TreeNode *)0x0;
    std::
    priority_queue<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jeinygroove[P]Huffman-Archiver/src/huffman_tree.cpp:14:17)>
    ::pop(&local_58);
    if ((local_90->_M_h)._M_element_count == 1) {
      local_c8._0_8_ =
           (__uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>)0x0;
      local_b8._M_t.
      super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
      super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl._0_1_ = 0x20;
      local_b8._M_t.
      super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
      super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl._4_4_ =
           *(int *)((long)__p_00.
                          super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>
                          .super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl + 4);
      local_80._M_t.
      super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
      super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl =
           (tuple<HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)
           (_Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)0x0;
      local_a8._M_t.
      super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
      super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl =
           (tuple<HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)
           (_Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)0x0;
      local_88._M_t.
      super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
      super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl =
           (tuple<HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)
           (_Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)0x0;
      local_a0 = false;
      _Stack_b0._M_t.
      super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
      super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl =
           (tuple<HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)
           (tuple<HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>)
           __p_00.
           super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
           super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
           super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl;
      std::make_unique<HuffTree::TreeNode,HuffTree::TreeNode>((TreeNode *)(local_c8 + 8));
      __p_01 = local_c8._8_8_;
      local_c8._8_8_ =
           (__uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>)0x0;
      std::__uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::reset
                ((__uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                 local_98,(pointer)__p_01);
      std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
                ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                 (local_c8 + 8));
      TreeNode::~TreeNode((TreeNode *)&local_b8);
      std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
                ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                 &local_88);
      std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
                ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                 &local_80);
    }
    else {
      local_c8._0_8_ = (_Head_base<0UL,_HuffTree::TreeNode_*,_false>)0x0;
      std::__uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::reset
                ((__uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                 local_98,(pointer)__p_00.
                                   super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>
                                   .super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl)
      ;
    }
    std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
              ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)local_c8)
    ;
  }
  std::
  vector<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>,_std::allocator<std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>_>_>
  ::~vector(&local_58.c);
  return;
}

Assistant:

HuffTree::HuffTree(const std::unordered_map<char, int> &data) {
    auto comp = [](const std::unique_ptr<TreeNode> &l, const std::unique_ptr<TreeNode> &r) -> bool {
        return (l->_freq > r->_freq);
    };

    std::priority_queue<std::unique_ptr<TreeNode>,
            std::vector<std::unique_ptr<TreeNode>>,
            decltype(comp)> MinHeap(comp);

    for (auto i : data) {
        MinHeap.push(std::make_unique<TreeNode>(TreeNode(i.first, i.second, nullptr, nullptr, true)));
    }
    std::size_t size = data.size();
    while (size > 1) {
        std::unique_ptr<TreeNode> l(std::move(const_cast<std::unique_ptr<TreeNode> &>(MinHeap.top())));
        MinHeap.pop();

        std::unique_ptr<TreeNode> r(std::move(const_cast<std::unique_ptr<TreeNode> &>(MinHeap.top())));
        MinHeap.pop();

        int freq = l->_freq + r->_freq;
        MinHeap.push(std::make_unique<TreeNode>(TreeNode(' ', freq, std::move(l), std::move(r), false)));
        size--;
    }
    if (!MinHeap.empty()) {
        std::unique_ptr<TreeNode> top(std::move(const_cast<std::unique_ptr<TreeNode> &>(MinHeap.top())));
        MinHeap.pop();
        if (data.size() == 1) {
            int freq = top->_freq;
            root = std::make_unique<TreeNode>(TreeNode(' ', freq, std::move(top),
                                                       nullptr, false));
        } else {
            root = std::move(const_cast<std::unique_ptr<TreeNode> &>(top));
        }
    }
}